

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

void RefineEntropyCodesDistance
               (uint16_t *data,size_t length,size_t stride,size_t num_histograms,
               HistogramDistance *histograms)

{
  uint16_t *puVar1;
  undefined1 local_898 [8];
  HistogramDistance sample;
  size_t iter;
  double dStack_58;
  uint seed;
  size_t iters;
  HistogramDistance *histograms_local;
  size_t num_histograms_local;
  size_t stride_local;
  size_t length_local;
  uint16_t *data_local;
  ulong local_20;
  size_t i;
  long local_10;
  
  iter._4_4_ = 7;
  dStack_58 = (double)((((length << 1) / stride + num_histograms + 99) / num_histograms) *
                      num_histograms);
  iters = (size_t)histograms;
  histograms_local = (HistogramDistance *)num_histograms;
  num_histograms_local = stride;
  stride_local = length;
  length_local = (size_t)data;
  for (sample.bit_cost_ = 0.0; (ulong)sample.bit_cost_ < (ulong)dStack_58;
      sample.bit_cost_ = (double)((long)sample.bit_cost_ + 1)) {
    data_local = (uint16_t *)local_898;
    memset(data_local,0,0x820);
    puVar1 = data_local;
    puVar1[0x410] = 0;
    puVar1[0x411] = 0;
    puVar1[0x412] = 0;
    puVar1[0x413] = 0;
    puVar1 = data_local;
    puVar1[0x414] = 0;
    puVar1[0x415] = 0;
    puVar1[0x416] = 0;
    puVar1[0x417] = 0x7ff0;
    RandomSampleDistance
              ((uint *)((long)&iter + 4),(uint16_t *)length_local,stride_local,num_histograms_local,
               (HistogramDistance *)local_898);
    local_10 = iters + ((ulong)sample.bit_cost_ % (ulong)histograms_local) * 0x830;
    i = (size_t)local_898;
    *(long *)(local_10 + 0x820) = sample.data_._2072_8_ + *(long *)(local_10 + 0x820);
    for (local_20 = 0; local_20 < 0x208; local_20 = local_20 + 1) {
      *(int *)(local_10 + local_20 * 4) =
           *(int *)(i + local_20 * 4) + *(int *)(local_10 + local_20 * 4);
    }
  }
  return;
}

Assistant:

static void FN(RefineEntropyCodes)(const DataType* data, size_t length,
                                   size_t stride,
                                   size_t num_histograms,
                                   HistogramType* histograms) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  size_t iter;
  iters = ((iters + num_histograms - 1) / num_histograms) * num_histograms;
  for (iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    FN(HistogramClear)(&sample);
    FN(RandomSample)(&seed, data, length, stride, &sample);
    FN(HistogramAddHistogram)(&histograms[iter % num_histograms], &sample);
  }
}